

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42drivr.c
# Opt level: O2

FT_UInt t42_get_name_index(T42_Face face,FT_String *glyph_name)

{
  uint uVar1;
  char *__s2;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (face->type1).num_glyphs;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  uVar5 = 0;
  while( true ) {
    if (uVar4 == uVar5) {
      return 0;
    }
    __s2 = (face->type1).glyph_names[uVar5];
    if ((*glyph_name == *__s2) && (iVar2 = strcmp(glyph_name,__s2), iVar2 == 0)) break;
    uVar5 = uVar5 + 1;
  }
  lVar3 = strtol((char *)(face->type1).charstrings[uVar5],(char **)0x0,10);
  return (FT_UInt)lVar3;
}

Assistant:

static FT_UInt
  t42_get_name_index( T42_Face    face,
                      FT_String*  glyph_name )
  {
    FT_Int  i;


    for ( i = 0; i < face->type1.num_glyphs; i++ )
    {
      FT_String*  gname = face->type1.glyph_names[i];


      if ( glyph_name[0] == gname[0] && !ft_strcmp( glyph_name, gname ) )
        return (FT_UInt)ft_strtol( (const char *)face->type1.charstrings[i],
                                   NULL, 10 );
    }

    return 0;
  }